

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O2

void net_serializer<std::vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>,_void>
     ::serialize(ostream *out,
                vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                *data)

{
  pointer pvVar1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *i;
  pointer data_00;
  
  net_serializer<int,_void>::serialize
            (out,(int)(((long)(data->
                              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(data->
                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) / 0x18));
  pvVar1 = (data->
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (data_00 = (data->
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; data_00 != pvVar1;
      data_00 = data_00 + 1) {
    net_serializer<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_void>
    ::serialize(out,data_00);
  }
  return;
}

Assistant:

static void serialize(std::ostream& out, const std::vector<T>& data){
        net_serializer<int>::serialize(out, data.size());
        for (const auto& i:data)
            net_serializer<T>::serialize(out, i);
    }